

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

Result<vkb::Swapchain> * __thiscall
vkb::SwapchainBuilder::build(Result<vkb::Swapchain> *__return_storage_ptr__,SwapchainBuilder *this)

{
  uint uVar1;
  VkSurfaceFormatKHR *pVVar2;
  VkSurfaceTransformFlagBitsKHR VVar3;
  uint32_t uVar4;
  VkPresentModeKHR *desired_pm;
  pointer pVVar5;
  VkPhysicalDevice pVVar6;
  pointer ppVVar7;
  code *pcVar8;
  VkFormat VVar9;
  long lVar10;
  uint uVar11;
  VkColorSpaceKHR VVar12;
  Swapchain *pSVar13;
  SwapchainBuilder *this_00;
  pointer pVVar14;
  Result<vkb::Swapchain> *pRVar15;
  VkColorSpaceKHR VVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  VkPresentModeKHR VVar20;
  byte bVar21;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> desired_present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> desired_formats;
  SurfaceSupportDetails surface_support;
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> images;
  Result<vkb::detail::SurfaceSupportDetails> surface_support_ret;
  VkPhysicalDevice in_stack_fffffffffffffdb8;
  undefined1 local_238 [92];
  uint uStack_1dc;
  uint local_1d8;
  uint32_t uStack_1d4;
  VkSurfaceTransformFlagBitsKHR VStack_1d0;
  uint32_t uStack_1cc;
  uint local_1c8;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_1c0;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_1a8;
  Swapchain local_188;
  VkSwapchainCreateInfoKHR local_128;
  anon_union_24_2_293c120a_for_Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>_1
  local_c0;
  char local_a8;
  undefined1 local_a0 [80];
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_50;
  bool local_38;
  
  bVar21 = 0;
  if ((this->info).surface == (VkSurfaceKHR)0x0) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = 0;
    __return_storage_ptr__->m_init = false;
    return __return_storage_ptr__;
  }
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_238 + 0x18),
             &(this->info).desired_formats);
  if (local_238._32_8_ == local_238._24_8_) {
    local_a0._0_4_ = VK_FORMAT_B8G8R8A8_SRGB;
    local_a0._4_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::
    emplace_back<VkSurfaceFormatKHR>
              ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_238 + 0x18)
               ,(VkSurfaceFormatKHR *)local_a0);
    local_a0._0_4_ = VK_FORMAT_R8G8B8A8_SRGB;
    local_a0._4_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::
    emplace_back<VkSurfaceFormatKHR>
              ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_238 + 0x18)
               ,(VkSurfaceFormatKHR *)local_a0);
  }
  this_00 = (SwapchainBuilder *)local_238;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)this_00,
             &(this->info).desired_present_modes);
  if (local_238._8_8_ == local_238._0_8_) {
    add_desired_present_modes
              (this_00,(vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_238);
  }
  detail::query_surface_support_details(in_stack_fffffffffffffdb8,(VkSurfaceKHR)0x10b0d3);
  if (local_38 == false) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = local_a0._16_4_;
    __return_storage_ptr__->m_init = false;
    goto LAB_0010b623;
  }
  local_1c8 = local_a0._48_4_;
  local_238._80_4_ = local_a0._16_4_;
  local_238._84_4_ = local_a0._20_4_;
  local_1d8 = local_a0._32_4_;
  uStack_1d4 = local_a0._36_4_;
  VStack_1d0 = local_a0._40_4_;
  uStack_1cc = local_a0._44_4_;
  local_238._88_4_ = local_a0._24_4_;
  uStack_1dc = local_a0._28_4_;
  local_238._64_8_ = local_a0._0_8_;
  local_238._72_8_ = local_a0._8_8_;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            (&local_1c0,
             (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)(local_a0 + 0x38));
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector(&local_1a8,&local_50);
  VVar12 = (this->info).required_min_image_count;
  if (VVar12 == VK_COLORSPACE_SRGB_NONLINEAR_KHR) {
    VVar16 = (this->info).min_image_count;
    if (VVar16 == VK_COLORSPACE_SRGB_NONLINEAR_KHR) {
      VVar12 = local_238._64_4_ + 1;
    }
    else {
      VVar12 = local_238._64_4_;
      if ((uint)local_238._64_4_ < VVar16) {
        VVar12 = VVar16;
      }
    }
LAB_0010b192:
    VVar16 = local_238._68_4_;
    if (VVar12 < (uint)local_238._68_4_) {
      VVar16 = VVar12;
    }
    pVVar2 = (VkSurfaceFormatKHR *)local_238._24_8_;
    if (local_238._68_4_ == VK_COLORSPACE_SRGB_NONLINEAR_KHR) {
      VVar16 = VVar12;
    }
    for (; pVVar2 != (VkSurfaceFormatKHR *)local_238._32_8_; pVVar2 = pVVar2 + 1) {
      if (local_1c0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_1c0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pVVar5 = local_1c0.
                 super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
                 .super__Vector_impl_data._M_start;
        do {
          if ((pVVar2->format == pVVar5->format) && (pVVar2->colorSpace == pVVar5->colorSpace)) {
            pVVar5 = (pointer)&local_128;
            local_128.sType = pVVar2->format;
            local_128._4_4_ = pVVar2->colorSpace;
            goto LAB_0010b20a;
          }
          pVVar5 = pVVar5 + 1;
        } while (pVVar5 != local_1c0.
                           super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    local_128.sType = VK_FORMAT_R5G6B5_UNORM_PACK16;
    pVVar5 = local_1c0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
             _M_impl.super__Vector_impl_data._M_start;
LAB_0010b20a:
    if (local_238._72_4_ == 0xffffffff) {
      uVar17 = (this->info).desired_width;
      uVar18 = (this->info).desired_height;
      if ((uint)local_238._88_4_ < uVar17) {
        uVar17 = local_238._88_4_;
      }
      if (uVar17 < (uint)local_238._80_4_) {
        uVar17 = local_238._80_4_;
      }
      if (uStack_1dc < uVar18) {
        uVar18 = uStack_1dc;
      }
      uVar19 = (ulong)uVar18;
      if (uVar18 < (uint)local_238._84_4_) {
        uVar19 = (ulong)(uint)local_238._84_4_;
      }
    }
    else {
      uVar19 = (ulong)local_238._72_8_ >> 0x20;
      uVar17 = local_238._72_4_;
    }
    uVar18 = (this->info).array_layer_count;
    uVar1 = local_1d8;
    if (uVar18 <= local_1d8) {
      uVar1 = uVar18;
    }
    uVar11 = 1;
    if (uVar18 != 0) {
      uVar11 = uVar1;
    }
    local_238._56_8_ = *(undefined8 *)&(this->info).graphics_queue_index;
    for (pVVar6 = (VkPhysicalDevice)local_238._0_8_; pVVar6 != (VkPhysicalDevice)local_238._8_8_;
        pVVar6 = pVVar6 + 4) {
      if (local_1a8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1a8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        VVar20 = *(VkPresentModeKHR *)pVVar6;
        pVVar14 = local_1a8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          if (VVar20 == *pVVar14) {
            if (VK_PRESENT_MODE_FIFO_RELAXED_KHR < VVar20) goto LAB_0010b2da;
            goto LAB_0010b2c7;
          }
          pVVar14 = pVVar14 + 1;
        } while (pVVar14 !=
                 local_1a8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    VVar20 = VK_PRESENT_MODE_FIFO_KHR;
LAB_0010b2c7:
    if (((this->info).image_usage_flags & ~local_1c8) != 0) {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 6;
      goto LAB_0010b5d3;
    }
LAB_0010b2da:
    VVar3 = (this->info).pre_transform;
    if (VVar3 == 0) {
      VVar3 = VStack_1d0;
    }
    local_128.pNext = (void *)0x0;
    local_128.preTransform = 0;
    local_128.compositeAlpha = 0;
    local_128.presentMode = VK_PRESENT_MODE_IMMEDIATE_KHR;
    local_128.clipped = 0;
    local_128.queueFamilyIndexCount = 0;
    local_128._68_4_ = 0;
    local_128.pQueueFamilyIndices = (uint32_t *)0x0;
    local_128.imageExtent.height = 0;
    local_128.imageArrayLayers = 0;
    local_128.imageUsage = 0;
    local_128.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    local_128.minImageCount = 0;
    local_128.imageFormat = VK_FORMAT_UNDEFINED;
    local_128.imageColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    local_128.imageExtent.width = 0;
    local_128.flags = 0;
    local_128._20_4_ = 0;
    local_128.surface = (VkSurfaceKHR)0x0;
    local_128.oldSwapchain = (VkSwapchainKHR)0x0;
    local_128.sType = 0x3b9acde8;
    local_128._4_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    local_238._48_8_ = *pVVar5;
    detail::setup_pNext_chain<VkSwapchainCreateInfoKHR>(&local_128,&(this->info).pNext_chain);
    for (ppVVar7 = (this->info).pNext_chain.
                   super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppVVar7 !=
        (this->info).pNext_chain.
        super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppVVar7 = ppVVar7 + 1) {
      if ((*ppVVar7)->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                      "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                      ,0x7b1,"Result<Swapchain> vkb::SwapchainBuilder::build() const");
      }
    }
    local_128.flags = (this->info).create_flags;
    local_128.surface = (this->info).surface;
    VVar9 = (VkFormat)local_238._48_8_;
    local_128.imageFormat = VVar9;
    local_128.minImageCount = VVar16;
    VVar12 = SUB84(local_238._48_8_,4);
    local_128.imageExtent.height = (uint32_t)uVar19;
    local_128.imageSharingMode._0_1_ =
         (this->info).graphics_queue_index != (this->info).present_queue_index;
    if ((bool)(undefined1)local_128.imageSharingMode) {
      local_128.queueFamilyIndexCount = 2;
      local_128.pQueueFamilyIndices = (uint32_t *)(local_238 + 0x38);
    }
    local_128.imageUsage = (this->info).image_usage_flags;
    local_128.imageSharingMode._1_3_ = 0;
    local_128.compositeAlpha = (this->info).composite_alpha;
    local_128.preTransform = VVar3;
    local_128.clipped._0_1_ = (this->info).clipped;
    local_128.presentMode = VVar20;
    local_128.clipped._1_3_ = 0;
    local_128.oldSwapchain = (this->info).old_swapchain;
    local_188.extent.width = 0;
    local_188.extent.height = 0;
    local_188.requested_min_image_count = 0;
    local_188.present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
    local_188.image_count = 0;
    local_188.image_format = VK_FORMAT_UNDEFINED;
    local_188.color_space = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    local_188.image_usage_flags = 0;
    local_188.device = (VkDevice)0x0;
    local_188.swapchain = (VkSwapchainKHR)0x0;
    local_188.instance_version = 0x400000;
    local_188._52_4_ = 0;
    local_188.allocation_callbacks = (VkAllocationCallbacks *)0x0;
    local_188.internal_table.fp_vkGetSwapchainImagesKHR = (PFN_vkGetSwapchainImagesKHR)0x0;
    local_188.internal_table.fp_vkCreateImageView = (PFN_vkCreateImageView)0x0;
    local_188.internal_table.fp_vkDestroyImageView = (PFN_vkDestroyImageView)0x0;
    local_188.internal_table.fp_vkDestroySwapchainKHR = (PFN_vkDestroySwapchainKHR)0x0;
    local_128.imageColorSpace = VVar12;
    local_128.imageExtent.width = uVar17;
    local_128.imageArrayLayers = uVar11;
    pcVar8 = (code *)(*(code *)detail::vulkan_functions()::v._192_8_)
                               ((this->info).device,"vkCreateSwapchainKHR");
    uVar4 = (*pcVar8)((this->info).device,&local_128,(this->info).allocation_callbacks,
                      &local_188.swapchain);
    if (uVar4 != 0) {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 2;
      (__return_storage_ptr__->field_0).m_value.swapchain =
           (VkSwapchainKHR)&detail::swapchain_error_category;
      (__return_storage_ptr__->field_0).m_value.image_count = uVar4;
      goto LAB_0010b5e5;
    }
    local_188.device = (this->info).device;
    local_188.image_format = VVar9;
    local_188.image_usage_flags = (this->info).image_usage_flags;
    local_188.color_space = VVar12;
    local_188.extent = (VkExtent2D)((ulong)uVar17 | uVar19 << 0x20);
    local_188.internal_table.fp_vkGetSwapchainImagesKHR =
         (PFN_vkGetSwapchainImagesKHR)
         (*(code *)detail::vulkan_functions()::v._192_8_)
                   (local_188.device,"vkGetSwapchainImagesKHR");
    local_188.internal_table.fp_vkCreateImageView =
         (PFN_vkCreateImageView)
         (*(code *)detail::vulkan_functions()::v._192_8_)((this->info).device,"vkCreateImageView");
    local_188.internal_table.fp_vkDestroyImageView =
         (PFN_vkDestroyImageView)
         (*(code *)detail::vulkan_functions()::v._192_8_)((this->info).device,"vkDestroyImageView");
    local_188.internal_table.fp_vkDestroySwapchainKHR =
         (PFN_vkDestroySwapchainKHR)
         (*(code *)detail::vulkan_functions()::v._192_8_)
                   ((this->info).device,"vkDestroySwapchainKHR");
    Swapchain::get_images
              ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)&local_c0.m_value,
               &local_188);
    if (local_a8 == '\0') {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 3;
      goto LAB_0010b5d3;
    }
    local_188.present_mode = VVar20;
    local_188.requested_min_image_count = VVar16;
    local_188.image_count =
         (uint32_t)
         ((ulong)((long)local_c0.m_value.
                        super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - local_c0._0_8_) >> 3);
    local_188.instance_version = (this->info).instance_version;
    local_188.allocation_callbacks = (this->info).allocation_callbacks;
    pSVar13 = &local_188;
    pRVar15 = __return_storage_ptr__;
    for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pRVar15->field_0).m_value.device = pSVar13->device;
      pSVar13 = (Swapchain *)((long)pSVar13 + ((ulong)bVar21 * -2 + 1) * 8);
      pRVar15 = (Result<vkb::Swapchain> *)((long)pRVar15 + (ulong)bVar21 * -0x10 + 8);
    }
    __return_storage_ptr__->m_init = true;
    if (local_c0.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.m_value.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.m_value.
                            super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - local_c0._0_8_);
    }
  }
  else {
    if ((uint)local_238._64_4_ <= VVar12) goto LAB_0010b192;
    (__return_storage_ptr__->field_0).m_error.type._M_value = 5;
LAB_0010b5d3:
    (__return_storage_ptr__->field_0).m_value.swapchain =
         (VkSwapchainKHR)&detail::swapchain_error_category;
    (__return_storage_ptr__->field_0).m_value.image_count = 0;
LAB_0010b5e5:
    __return_storage_ptr__->m_init = false;
  }
  if (local_1a8.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1c0.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010b623:
  Result<vkb::detail::SurfaceSupportDetails>::destroy
            ((Result<vkb::detail::SurfaceSupportDetails> *)local_a0);
  if ((VkPhysicalDevice)local_238._0_8_ != (VkPhysicalDevice)0x0) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
  }
  if ((VkSurfaceFormatKHR *)local_238._24_8_ != (VkSurfaceFormatKHR *)0x0) {
    operator_delete((void *)local_238._24_8_,local_238._40_8_ - local_238._24_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Swapchain> SwapchainBuilder::build() const {
    if (info.surface == VK_NULL_HANDLE) {
        return Error{ SwapchainError::surface_handle_not_provided };
    }

    auto desired_formats = info.desired_formats;
    if (desired_formats.size() == 0) add_desired_formats(desired_formats);
    auto desired_present_modes = info.desired_present_modes;
    if (desired_present_modes.size() == 0) add_desired_present_modes(desired_present_modes);

    auto surface_support_ret = detail::query_surface_support_details(info.physical_device, info.surface);
    if (!surface_support_ret.has_value())
        return Error{ SwapchainError::failed_query_surface_support_details, surface_support_ret.vk_result() };
    auto surface_support = surface_support_ret.value();

    uint32_t image_count = info.min_image_count;
    if (info.required_min_image_count >= 1) {
        if (info.required_min_image_count < surface_support.capabilities.minImageCount)
            return make_error_code(SwapchainError::required_min_image_count_too_low);

        image_count = info.required_min_image_count;
    } else if (info.min_image_count == 0) {
        // We intentionally use minImageCount + 1 to maintain existing behavior, even if it typically results in triple buffering on most systems.
        image_count = surface_support.capabilities.minImageCount + 1;
    } else {
        image_count = info.min_image_count;
        if (image_count < surface_support.capabilities.minImageCount)
            image_count = surface_support.capabilities.minImageCount;
    }
    if (surface_support.capabilities.maxImageCount > 0 && image_count > surface_support.capabilities.maxImageCount) {
        image_count = surface_support.capabilities.maxImageCount;
    }

    VkSurfaceFormatKHR surface_format = detail::find_best_surface_format(surface_support.formats, desired_formats);

    VkExtent2D extent = detail::find_extent(surface_support.capabilities, info.desired_width, info.desired_height);

    uint32_t image_array_layers = info.array_layer_count;
    if (surface_support.capabilities.maxImageArrayLayers < info.array_layer_count)
        image_array_layers = surface_support.capabilities.maxImageArrayLayers;
    if (info.array_layer_count == 0) image_array_layers = 1;

    uint32_t queue_family_indices[] = { info.graphics_queue_index, info.present_queue_index };


    VkPresentModeKHR present_mode = detail::find_present_mode(surface_support.present_modes, desired_present_modes);

    // VkSurfaceCapabilitiesKHR::supportedUsageFlags is only only valid for some present modes. For shared present modes, we should also check VkSharedPresentSurfaceCapabilitiesKHR::sharedPresentSupportedUsageFlags.
    auto is_unextended_present_mode = [](VkPresentModeKHR present_mode) {
        return (present_mode == VK_PRESENT_MODE_IMMEDIATE_KHR) || (present_mode == VK_PRESENT_MODE_MAILBOX_KHR) ||
               (present_mode == VK_PRESENT_MODE_FIFO_KHR) || (present_mode == VK_PRESENT_MODE_FIFO_RELAXED_KHR);
    };

    if (is_unextended_present_mode(present_mode) &&
        (info.image_usage_flags & surface_support.capabilities.supportedUsageFlags) != info.image_usage_flags) {
        return Error{ SwapchainError::required_usage_not_supported };
    }

    VkSurfaceTransformFlagBitsKHR pre_transform = info.pre_transform;
    if (info.pre_transform == static_cast<VkSurfaceTransformFlagBitsKHR>(0))
        pre_transform = surface_support.capabilities.currentTransform;

    VkSwapchainCreateInfoKHR swapchain_create_info = {};
    swapchain_create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    detail::setup_pNext_chain(swapchain_create_info, info.pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : info.pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    swapchain_create_info.flags = info.create_flags;
    swapchain_create_info.surface = info.surface;
    swapchain_create_info.minImageCount = image_count;
    swapchain_create_info.imageFormat = surface_format.format;
    swapchain_create_info.imageColorSpace = surface_format.colorSpace;
    swapchain_create_info.imageExtent = extent;
    swapchain_create_info.imageArrayLayers = image_array_layers;
    swapchain_create_info.imageUsage = info.image_usage_flags;

    if (info.graphics_queue_index != info.present_queue_index) {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
        swapchain_create_info.queueFamilyIndexCount = 2;
        swapchain_create_info.pQueueFamilyIndices = queue_family_indices;
    } else {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    }

    swapchain_create_info.preTransform = pre_transform;
    swapchain_create_info.compositeAlpha = info.composite_alpha;
    swapchain_create_info.presentMode = present_mode;
    swapchain_create_info.clipped = info.clipped;
    swapchain_create_info.oldSwapchain = info.old_swapchain;
    Swapchain swapchain{};
    PFN_vkCreateSwapchainKHR swapchain_create_proc;
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain_create_proc, "vkCreateSwapchainKHR");
    auto res = swapchain_create_proc(info.device, &swapchain_create_info, info.allocation_callbacks, &swapchain.swapchain);

    if (res != VK_SUCCESS) {
        return Error{ SwapchainError::failed_create_swapchain, res };
    }
    swapchain.device = info.device;
    swapchain.image_format = surface_format.format;
    swapchain.color_space = surface_format.colorSpace;
    swapchain.image_usage_flags = info.image_usage_flags;
    swapchain.extent = extent;
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkGetSwapchainImagesKHR, "vkGetSwapchainImagesKHR");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkCreateImageView, "vkCreateImageView");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkDestroyImageView, "vkDestroyImageView");
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkDestroySwapchainKHR, "vkDestroySwapchainKHR");
    auto images = swapchain.get_images();
    if (!images) {
        return Error{ SwapchainError::failed_get_swapchain_images };
    }
    swapchain.requested_min_image_count = image_count;
    swapchain.present_mode = present_mode;
    swapchain.image_count = static_cast<uint32_t>(images.value().size());
    swapchain.instance_version = info.instance_version;
    swapchain.allocation_callbacks = info.allocation_callbacks;
    return swapchain;
}